

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void updateXdgSizeLimits(_GLFWwindow *window)

{
  int32_t local_20;
  int32_t local_1c;
  int maxheight;
  int maxwidth;
  int minheight;
  int minwidth;
  _GLFWwindow *window_local;
  
  if (window->resizable == 0) {
    local_1c = (window->wl).width;
    local_20 = (window->wl).height;
    maxheight = local_20;
    maxwidth = local_1c;
  }
  else {
    if ((window->minwidth == -1) || (window->minheight == -1)) {
      maxheight = 0;
      maxwidth = 0;
    }
    else {
      maxwidth = window->minwidth;
      maxheight = window->minheight;
      if ((window->wl).fallback.decorations != 0) {
        maxwidth = maxwidth + 8;
        maxheight = maxheight + 0x1c;
      }
    }
    if ((window->maxwidth == -1) || (window->maxheight == -1)) {
      local_20 = 0;
      local_1c = 0;
    }
    else {
      local_1c = window->maxwidth;
      local_20 = window->maxheight;
      if ((window->wl).fallback.decorations != 0) {
        local_1c = local_1c + 8;
        local_20 = local_20 + 0x1c;
      }
    }
  }
  xdg_toplevel_set_min_size((window->wl).xdg.toplevel,maxwidth,maxheight);
  xdg_toplevel_set_max_size((window->wl).xdg.toplevel,local_1c,local_20);
  return;
}

Assistant:

static void updateXdgSizeLimits(_GLFWwindow* window)
{
    int minwidth, minheight, maxwidth, maxheight;

    if (window->resizable)
    {
        if (window->minwidth == GLFW_DONT_CARE || window->minheight == GLFW_DONT_CARE)
            minwidth = minheight = 0;
        else
        {
            minwidth  = window->minwidth;
            minheight = window->minheight;

            if (window->wl.fallback.decorations)
            {
                minwidth  += GLFW_BORDER_SIZE * 2;
                minheight += GLFW_CAPTION_HEIGHT + GLFW_BORDER_SIZE;
            }
        }

        if (window->maxwidth == GLFW_DONT_CARE || window->maxheight == GLFW_DONT_CARE)
            maxwidth = maxheight = 0;
        else
        {
            maxwidth  = window->maxwidth;
            maxheight = window->maxheight;

            if (window->wl.fallback.decorations)
            {
                maxwidth  += GLFW_BORDER_SIZE * 2;
                maxheight += GLFW_CAPTION_HEIGHT + GLFW_BORDER_SIZE;
            }
        }
    }
    else
    {
        minwidth = maxwidth = window->wl.width;
        minheight = maxheight = window->wl.height;
    }

    xdg_toplevel_set_min_size(window->wl.xdg.toplevel, minwidth, minheight);
    xdg_toplevel_set_max_size(window->wl.xdg.toplevel, maxwidth, maxheight);
}